

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O2

void MPIX_INAPrecv(void *buf,NAPComm *nap_comm,MPI_Datatype datatype,int tag,MPI_Comm comm,
                  NAPData *nap_data)

{
  MPI_Request *recv_requests;
  undefined8 *puVar1;
  char *local_L_buffer;
  char *global_recv_buffer;
  
  puVar1 = (undefined8 *)operator_new(0x28);
  puVar1[1] = 0;
  puVar1[2] = 0;
  *(undefined **)(datatype + 0x18) = &ompi_mpi_comm_world;
  *(undefined4 *)(puVar1 + 4) = 0x4fc7;
  *puVar1 = buf;
  puVar1[3] = &ompi_mpi_int;
  recv_requests = nap_comm->recv_requests;
  global_recv_buffer = (char *)0x0;
  local_L_buffer = (char *)0x0;
  MPIX_step_recv(nap_comm->global_comm,0x4fc7,(MPI_Comm)&ompi_mpi_comm_world,
                 (MPI_Datatype)&ompi_mpi_int,recv_requests,&global_recv_buffer);
  if (nap_comm->local_L_comm->recv_data->num_msgs == 0) {
    local_L_buffer = (char *)0x0;
  }
  else {
    MPIX_step_recv(nap_comm->local_L_comm,0x4fca,nap_comm->topo_info->local_comm,
                   (MPI_Datatype)&ompi_mpi_int,
                   recv_requests + nap_comm->global_comm->recv_data->num_msgs,&local_L_buffer);
  }
  puVar1[1] = global_recv_buffer;
  puVar1[2] = local_L_buffer;
  *(undefined8 **)(datatype + 8) = puVar1;
  return;
}

Assistant:

static void MPIX_INAPrecv(void* buf, NAPComm* nap_comm,
        MPI_Datatype datatype, int tag,
        MPI_Comm comm, NAPData* nap_data)
{
    NAPCommData* nap_recv_data = new NAPCommData();
    nap_data->mpi_comm = comm;
    nap_recv_data->tag = tag;
    nap_recv_data->buf = buf;
    nap_recv_data->datatype = datatype;
    MPI_Request* global_recv_requests = NULL;
    MPI_Request* recv_requests = nap_comm->recv_requests;
    MPI_Request* L_recv_requests = NULL;
    char* global_recv_buffer = NULL;
    char* local_L_buffer = NULL;

    int local_L_tag = tag + 3;

    // Initialize Irecvs for inter-node step (step 2 in nap comm)
    MPIX_step_recv(nap_comm->global_comm, tag, comm, datatype,
            recv_requests, &global_recv_buffer);

    if (nap_comm->local_L_comm->recv_data->num_msgs)
    {
        L_recv_requests = &(recv_requests[nap_comm->global_comm->recv_data->num_msgs]);
        MPIX_step_recv(nap_comm->local_L_comm, local_L_tag, nap_comm->topo_info->local_comm,
                datatype, L_recv_requests, &local_L_buffer);
    }

    // Store global_recv_requests and global_recv_buffer, as to not free data
    // before recvs are finished
    nap_recv_data->global_buffer = global_recv_buffer;
    nap_recv_data->local_L_buffer = local_L_buffer;
    nap_data->recv_data = nap_recv_data;
}